

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_opcode_dss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long alStack_100 [3];
  char acStack_e8 [8];
  size_t local_e0;
  char local_d8 [8];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  local_e0 = 0x40;
  alStack_100[2] = 0x124c0c;
  make_D3D_destarg_string(ctx,src0 + 0x38,0x40);
  alStack_100[2] = 0x124c27;
  make_D3D_srcarg_string(ctx,0,src1 + 0x38,local_e0);
  alStack_100[2] = 0x124c43;
  make_D3D_srcarg_string(ctx,1,local_d8,local_e0);
  alStack_100[2] = 0x124c4c;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)alStack_100 + lVar1 + 0x10) = 0x124c66;
  pcVar3 = lowercase(acStack_e8 + lVar1,opcode);
  pcVar4 = "";
  if (ctx->coissue != 0) {
    pcVar4 = "+";
  }
  *(char **)((long)alStack_100 + lVar1 + 8) = local_d8;
  *(undefined8 *)((long)alStack_100 + lVar1) = 0x124cb9;
  output_line(ctx,"%s%s%s, %s, %s",pcVar4,pcVar3,src0 + 0x38,src1 + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_dss(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s, %s", ctx->coissue ? "+" : "",
                opcode, dst, src0, src1);
}